

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QList<QByteArray> * __thiscall
QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::operator[]
          (QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *this,KnownHeaders *key)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
  *pQVar2;
  longlong __old_val;
  _Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_> _Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>,_bool>
  pVar6;
  QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> copy;
  QArrayDataPointer<QByteArray> local_68;
  pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_> local_48;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 == (QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
          )(QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
            *)0x0;
  }
  else {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_28.d.ptr !=
        (QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
         *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
                          *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pQVar2 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var1 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if ((int)*key <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)*key];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  _Var3._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (_Var3._M_node = p_Var4, (int)*key < (int)p_Var4[1]._M_color)) {
    _Var3._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var3._M_node == p_Var1) {
    local_48.first = *key;
    local_68.d = (Data *)0x0;
    local_48.second.d.d = (Data *)0x0;
    local_68.ptr = (QByteArray *)0x0;
    local_48.second.d.ptr = (QByteArray *)0x0;
    local_68.size = 0;
    local_48.second.d.size = 0;
    pVar6 = std::
            _Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
            ::_M_insert_unique<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>
                      ((_Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
                        *)&pQVar2->m,&local_48);
    _Var3 = pVar6.first._M_node;
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48.second.d);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_68);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (QList<QByteArray> *)&_Var3._M_node[1]._M_parent;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }